

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O0

void __thiscall yactfr::internal::PktProc::buildRawProcFromShared(PktProc *this)

{
  bool bVar1;
  reference ppVar2;
  pointer this_00;
  pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>_>
  *idDsPktProcPair;
  iterator __end2;
  iterator __begin2;
  DsPktProcs *__range2;
  PktProc *this_local;
  
  Proc::buildRawProcFromShared(&this->_preambleProc);
  __end2 = std::
           unordered_map<unsigned_long_long,_std::unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>_>_>_>
           ::begin(&this->_dsPktProcs);
  idDsPktProcPair =
       (pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>_>
        *)std::
          unordered_map<unsigned_long_long,_std::unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>_>_>_>
          ::end(&this->_dsPktProcs);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>_>,_false>
                         *)&idDsPktProcPair);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>_>,_false,_false>
             ::operator*(&__end2);
    this_00 = std::
              unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>
              ::operator->(&ppVar2->second);
    DsPktProc::buildRawProcFromShared(this_00);
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>_>,_false,_false>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void PktProc::buildRawProcFromShared()
{
    _preambleProc.buildRawProcFromShared();

    for (const auto& idDsPktProcPair : _dsPktProcs) {
        idDsPktProcPair.second->buildRawProcFromShared();
    }
}